

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.cpp
# Opt level: O2

uint duckdb_zstd::FSE_optimalTableLog_internal
               (uint maxTableLog,size_t srcSize,uint maxSymbolValue,uint minus)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = (uint)srcSize;
  iVar1 = 0x1f;
  if (uVar3 - 1 != 0) {
    for (; uVar3 - 1 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  uVar2 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  uVar2 = (uVar2 ^ 0xffffffe0) + 0x21;
  uVar3 = 0x1f;
  if (maxSymbolValue != 0) {
    for (; maxSymbolValue >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  uVar3 = (uVar3 ^ 0xffffffe0) + 0x22;
  if (uVar2 < uVar3) {
    uVar3 = uVar2;
  }
  uVar2 = 0xb;
  if (maxTableLog != 0) {
    uVar2 = maxTableLog;
  }
  if (iVar1 - minus < uVar2) {
    uVar2 = iVar1 - minus;
  }
  if (uVar2 < uVar3) {
    uVar2 = uVar3;
  }
  uVar3 = 5;
  if (5 < uVar2) {
    uVar3 = uVar2;
  }
  uVar2 = 0xc;
  if (uVar3 < 0xc) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

unsigned FSE_optimalTableLog_internal(unsigned maxTableLog, size_t srcSize, unsigned maxSymbolValue, unsigned minus)
{
    U32 maxBitsSrc = ZSTD_highbit32((U32)(srcSize - 1)) - minus;
    U32 tableLog = maxTableLog;
    U32 minBits = FSE_minTableLog(srcSize, maxSymbolValue);
    assert(srcSize > 1); /* Not supported, RLE should be used instead */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (maxBitsSrc < tableLog) tableLog = maxBitsSrc;   /* Accuracy can be reduced */
    if (minBits > tableLog) tableLog = minBits;   /* Need a minimum to safely represent all symbol values */
    if (tableLog < FSE_MIN_TABLELOG) tableLog = FSE_MIN_TABLELOG;
    if (tableLog > FSE_MAX_TABLELOG) tableLog = FSE_MAX_TABLELOG;
    return tableLog;
}